

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyChord ImGui::FixupKeyChord(ImGuiKeyChord key_chord)

{
  bool bVar1;
  uint uVar2;
  undefined4 in_EDI;
  ImGuiKey key;
  undefined8 local_8;
  
  local_8 = CONCAT44(in_EDI,in_EDI) & 0xffffffffffff0fff;
  bVar1 = IsModKey((ImGuiKey)local_8);
  if (bVar1) {
    uVar2 = GetModForModKey((ImGuiKey)local_8);
    local_8 = (ulong)(uVar2 | local_8._4_4_) << 0x20;
  }
  return local_8._4_4_;
}

Assistant:

ImGuiKeyChord ImGui::FixupKeyChord(ImGuiKeyChord key_chord)
{
    // Add ImGuiMod_XXXX when a corresponding ImGuiKey_LeftXXX/ImGuiKey_RightXXX is specified.
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    if (IsModKey(key))
        key_chord |= GetModForModKey(key);
    return key_chord;
}